

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void normalize_image_u8_to_f32(clip_image_u8 *src,clip_image_f32 *dst,float *mean,float *std)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  byte *pbVar6;
  reference pvVar7;
  long in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  int c;
  size_t i;
  undefined4 *__new_size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ulong local_28;
  
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[1];
  __new_size = in_RSI + 2;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2));
  ::std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)__new_size);
  local_28 = 0;
  while( true ) {
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2));
    if (sVar5 <= local_28) break;
    iVar4 = (int)local_28 + (int)(local_28 / 3) * -3;
    pbVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                        local_28);
    bVar3 = *pbVar6;
    fVar1 = *(float *)(in_RDX + (long)iVar4 * 4);
    fVar2 = *(float *)(in_RCX + (long)iVar4 * 4);
    pvVar7 = ::std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RSI + 2),local_28);
    *pvVar7 = ((float)bVar3 / 255.0 - fVar1) / fVar2;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void normalize_image_u8_to_f32(const clip_image_u8 & src, clip_image_f32 & dst, const float mean[3], const float std[3]) {
    dst.nx = src.nx;
    dst.ny = src.ny;
    dst.buf.resize(src.buf.size());

    // TODO @ngxson : seems like this could be done more efficiently on cgraph
    for (size_t i = 0; i < src.buf.size(); ++i) {
        int c = i % 3; // rgb
        dst.buf[i] = (static_cast<float>(src.buf[i]) / 255.0f - mean[c]) / std[c];
    }
}